

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwSetWindowAspectRatio(GLFWwindow *handle,int numer,int denom)

{
  undefined8 in_RAX;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ProjectRage[P]Opengl-setup/libraries/glfw/src/window.c"
                  ,0x274,"void glfwSetWindowAspectRatio(GLFWwindow *, int, int)");
  }
  if (numer == 0) {
    __assert_fail("numer != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ProjectRage[P]Opengl-setup/libraries/glfw/src/window.c"
                  ,0x275,"void glfwSetWindowAspectRatio(GLFWwindow *, int, int)");
  }
  if (denom == 0) {
    __assert_fail("denom != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ProjectRage[P]Opengl-setup/libraries/glfw/src/window.c"
                  ,0x276,"void glfwSetWindowAspectRatio(GLFWwindow *, int, int)");
  }
  if (_glfw.initialized != 0) {
    if ((denom != -1 && numer != -1) && (numer < 1 || denom < 1)) {
      _glfwInputError(0x10004,"Invalid window aspect ratio %i:%i",numer,denom,in_RAX);
      return;
    }
    *(int *)(handle + 0x68) = numer;
    *(int *)(handle + 0x6c) = denom;
    if ((*(long *)(handle + 0x48) == 0) && (*(int *)(handle + 8) != 0)) {
      _glfwPlatformSetWindowAspectRatio((_GLFWwindow *)handle,numer,denom);
      return;
    }
    return;
  }
  _glfwInputError(0x10001,(char *)0x0,numer,in_RAX);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowAspectRatio(GLFWwindow* handle, int numer, int denom)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(numer != 0);
    assert(denom != 0);

    _GLFW_REQUIRE_INIT();

    if (numer != GLFW_DONT_CARE && denom != GLFW_DONT_CARE)
    {
        if (numer <= 0 || denom <= 0)
        {
            _glfwInputError(GLFW_INVALID_VALUE,
                            "Invalid window aspect ratio %i:%i",
                            numer, denom);
            return;
        }
    }

    window->numer = numer;
    window->denom = denom;

    if (window->monitor || !window->resizable)
        return;

    _glfwPlatformSetWindowAspectRatio(window, numer, denom);
}